

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O2

err_t cmdCVCsCheck(octet *certs,size_t certs_len)

{
  err_t eVar1;
  btok_cvc_t *cvc;
  size_t cert_len;
  
  cvc = (btok_cvc_t *)blobCreate(0x128);
  if (cvc == (btok_cvc_t *)0x0) {
    eVar1 = 0x6e;
  }
  else {
    for (; eVar1 = 0, certs_len != 0; certs_len = certs_len - cert_len) {
      cert_len = btokCVCLen(certs,certs_len);
      if (cert_len == 0xffffffffffffffff) {
        eVar1 = 0x204;
        break;
      }
      eVar1 = btokCVCUnwrap(cvc,certs,cert_len,(octet *)0x0,0);
      if (eVar1 != 0) break;
      certs = certs + cert_len;
    }
    blobClose(cvc);
  }
  return eVar1;
}

Assistant:

err_t cmdCVCsCheck(const octet* certs, size_t certs_len)
{
	err_t code;
	void* stack;
	btok_cvc_t* cvc;
	// pre
	ASSERT(memIsValid(certs, certs_len));
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(btok_cvc_t));
	ERR_CALL_CHECK(code);
	cvc = (btok_cvc_t*)stack;
	// цикл по сертификатам
	while (certs_len)
	{
		// разобрать сертификат
		size_t len = btokCVCLen(certs, certs_len);
		if (len == SIZE_MAX)
			code = ERR_BAD_CERTRING;
		else
			code = btokCVCUnwrap(cvc, certs, len, 0, 0);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// к следующему
		certs += len, certs_len -= len;
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}